

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlSchemaParticlePtr xmlSchemaAddParticle(void)

{
  xmlSchemaParticlePtr pxVar1;
  
  pxVar1 = (xmlSchemaParticlePtr)(*xmlMalloc)(0x30);
  if (pxVar1 == (xmlSchemaParticlePtr)0x0) {
    pxVar1 = (xmlSchemaParticlePtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xf,
                        (xmlError *)0x0);
  }
  else {
    *(undefined8 *)pxVar1 = 0;
    pxVar1->annot = (xmlSchemaAnnotPtr)0x0;
    pxVar1->minOccurs = 0;
    pxVar1->maxOccurs = 0;
    pxVar1->node = (xmlNodePtr)0x0;
    pxVar1->next = (xmlSchemaTreeItemPtr_conflict)0x0;
    pxVar1->children = (xmlSchemaTreeItemPtr_conflict)0x0;
    pxVar1->type = XML_SCHEMA_TYPE_PARTICLE;
    pxVar1->minOccurs = 1;
    pxVar1->maxOccurs = 1;
  }
  return pxVar1;
}

Assistant:

static xmlSchemaParticlePtr
xmlSchemaAddParticle(void)
{
    xmlSchemaParticlePtr ret = NULL;

    ret = (xmlSchemaParticlePtr)
	xmlMalloc(sizeof(xmlSchemaParticle));
    if (ret == NULL) {
	xmlSchemaTypeErrMemory();
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaParticle));
    ret->type = XML_SCHEMA_TYPE_PARTICLE;
    ret->minOccurs = 1;
    ret->maxOccurs = 1;
    return (ret);
}